

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

void S_ChannelEnded(FISoundChannel *ichan)

{
  void *pvVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  FSoundChan *schan;
  
  if (ichan == (FISoundChannel *)0x0) {
    return;
  }
  fVar2 = ichan[1].DistanceScale;
  if (((uint)fVar2 & 4) != 0) goto LAB_002fedd9;
  if (((uint)fVar2 & 0x102) == 0) {
    uVar3 = (*GSnd->_vptr_SoundRenderer[0x13])(GSnd,ichan);
    uVar4 = (*GSnd->_vptr_SoundRenderer[9])
                      (GSnd,S_sfx.Array[ichan[1].Rolloff.RolloffType].data.data);
    if (uVar3 == 0) {
      fVar2 = ichan[1].DistanceScale;
      if (((uint)fVar2 >> 9 & 1) == 0) goto LAB_002fedd9;
    }
    else {
      if (uVar4 <= uVar3) {
LAB_002fedd9:
        pvVar1 = ichan[1].SysChannel;
        *(void **)ichan[1].StartTime = pvVar1;
        if (pvVar1 != (void *)0x0) {
          *(QWORD_UNION *)((long)pvVar1 + 0x30) = ichan[1].StartTime;
        }
        ichan[2].SysChannel = (void *)0x0;
        ichan[2].StartTime.AsOne = 0;
        *(undefined8 *)&ichan[1].Rolloff.field_2 = 0;
        ichan[1].DistanceSqr = 0.0;
        ichan[1].ManualRolloff = false;
        *(undefined3 *)&ichan[1].field_0x25 = 0;
        ichan[1].StartTime.AsOne = 0;
        ichan[1].Rolloff.RolloffType = 0;
        ichan[1].Rolloff.MinDistance = 0.0;
        ichan->DistanceSqr = 0.0;
        ichan->ManualRolloff = false;
        *(undefined3 *)&ichan->field_0x25 = 0;
        ichan[1].SysChannel = (void *)0x0;
        (ichan->Rolloff).RolloffType = 0;
        (ichan->Rolloff).MinDistance = 0.0;
        *(undefined8 *)&(ichan->Rolloff).field_2 = 0;
        ichan->SysChannel = (void *)0x0;
        (ichan->StartTime).AsOne = 0;
        ichan[2].Rolloff.RolloffType = 0;
        ichan[2].Rolloff.MinDistance = 0.0;
        ichan[1].SysChannel = FreeChannels;
        if (FreeChannels != (FSoundChan *)0x0) {
          FreeChannels->PrevChan = (FSoundChan **)(ichan + 1);
        }
        FreeChannels = (FSoundChan *)ichan;
        ichan[1].StartTime.AsOne = (QWORD)&FreeChannels;
        return;
      }
      fVar2 = ichan[1].DistanceScale;
    }
  }
  ichan[1].DistanceScale = (float)((uint)fVar2 | 2);
  ichan->SysChannel = (void *)0x0;
  return;
}

Assistant:

void S_ChannelEnded(FISoundChannel *ichan)
{
	FSoundChan *schan = static_cast<FSoundChan*>(ichan);
	bool evicted;

	if (schan != NULL)
	{
		// If the sound was stopped with GSnd->StopSound(), then we know
		// it wasn't evicted. Otherwise, if it's looping, it must have
		// been evicted. If it's not looping, then it was evicted if it
		// didn't reach the end of its playback.
		if (schan->ChanFlags & CHAN_FORGETTABLE)
		{
			evicted = false;
		}
		else if (schan->ChanFlags & (CHAN_LOOP | CHAN_EVICTED))
		{
			evicted = true;
		}
		else
		{ 
			unsigned int pos = GSnd->GetPosition(schan);
			unsigned int len = GSnd->GetSampleLength(S_sfx[schan->SoundID].data);
			if (pos == 0)
			{
				evicted = !!(schan->ChanFlags & CHAN_JUSTSTARTED);
			}
			else
			{
				evicted = (pos < len);
			}
		}
		if (!evicted)
		{
			S_ReturnChannel(schan);
		}
		else
		{
			schan->ChanFlags |= CHAN_EVICTED;
			schan->SysChannel = NULL;
		}
	}
}